

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugNames::Abbrev::dump(Abbrev *this,ScopedPrinter *W)

{
  raw_ostream *prVar1;
  Child LHS;
  StringRef N;
  Child CVar2;
  ScopedPrinter *pSVar3;
  Child RHS;
  pointer pAVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  StringRef Fmt;
  StringRef Fmt_00;
  ulong local_108;
  undefined1 local_100 [32];
  pointer local_e0;
  pointer local_d8;
  pointer local_c8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  NodeKind local_90;
  char cStack_8f;
  undefined4 local_88;
  undefined4 uStack_84;
  NodeKind local_78;
  char cStack_77;
  ScopedPrinter *local_70;
  pointer local_68;
  DelimitedScope<___,____> local_60;
  DictScope AbbrevScope;
  
  Twine::Twine((Twine *)&local_a0,"Abbreviation 0x");
  local_108 = (ulong)this->Code;
  Twine::Twine((Twine *)&local_88,(Twine *)&local_108,UHexKind,(Child)0x0,EmptyKind);
  if ((local_90 == NullKind) || (local_78 == NullKind)) {
    AbbrevScope.W = (ScopedPrinter *)0x0;
  }
  else {
    uVar5 = local_88;
    uVar6 = uStack_84;
    if ((local_90 == EmptyKind) || (uVar5 = local_a0, uVar6 = uStack_9c, local_78 == EmptyKind)) {
      AbbrevScope.W._4_4_ = uVar6;
      AbbrevScope.W._0_4_ = uVar5;
    }
    else {
      LHS._4_4_ = uStack_9c;
      LHS.decUI = local_a0;
      if (cStack_8f != '\x01') {
        local_90 = TwineKind;
        LHS.twine = (Twine *)&local_a0;
      }
      if (cStack_77 != '\x01') {
        local_78 = TwineKind;
      }
      CVar2._4_4_ = uStack_84;
      CVar2.decUI = local_88;
      RHS.twine = (Twine *)&local_88;
      if (cStack_77 == '\x01') {
        RHS = CVar2;
      }
      Twine::Twine((Twine *)&AbbrevScope,LHS,local_90,RHS,local_78);
    }
  }
  Twine::str_abi_cxx11_((string *)local_100,(Twine *)&AbbrevScope);
  N.Length = local_100._8_8_;
  N.Data = (char *)local_100._0_8_;
  DelimitedScope<'{',_'}'>::DelimitedScope(&local_60,W,N);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  ScopedPrinter::printIndent(W);
  prVar1 = W->OS;
  AbbrevScope.W = (ScopedPrinter *)&PTR_anchor_00d77838;
  Fmt.Length = 9;
  Fmt.Data = "Tag: {0}\n";
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>::
  formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
                  *)local_100,Fmt,
                 (tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_> *)
                 &AbbrevScope);
  raw_ostream::operator<<(prVar1,(formatv_object_base *)local_100);
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  local_70 = W;
  if ((void *)local_100._16_8_ != (void *)0x0) {
    operator_delete((void *)local_100._16_8_,(long)local_e0 - local_100._16_8_);
  }
  pAVar4 = (this->Attributes).
           super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (this->Attributes).
             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar4 != local_68) {
    do {
      pSVar3 = local_70;
      ScopedPrinter::printIndent(local_70);
      prVar1 = pSVar3->OS;
      AbbrevScope.W = (ScopedPrinter *)&PTR_anchor_00d77618;
      Fmt_00.Length = 9;
      Fmt_00.Data = "{0}: {1}\n";
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
      ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
                        *)local_100,Fmt_00,
                       (tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>
                        *)&AbbrevScope);
      raw_ostream::operator<<(prVar1,(formatv_object_base *)local_100);
      if (local_d8 != (pointer)0x0) {
        operator_delete(local_d8,(long)local_c8 - (long)local_d8);
      }
      if ((void *)local_100._16_8_ != (void *)0x0) {
        operator_delete((void *)local_100._16_8_,(long)local_e0 - local_100._16_8_);
      }
      pAVar4 = pAVar4 + 1;
    } while (pAVar4 != local_68);
  }
  DelimitedScope<'{',_'}'>::~DelimitedScope(&local_60);
  return;
}

Assistant:

void DWARFDebugNames::Abbrev::dump(ScopedPrinter &W) const {
  DictScope AbbrevScope(W, ("Abbreviation 0x" + Twine::utohexstr(Code)).str());
  W.startLine() << formatv("Tag: {0}\n", Tag);

  for (const auto &Attr : Attributes)
    W.startLine() << formatv("{0}: {1}\n", Attr.Index, Attr.Form);
}